

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEditPrivate::setSelected(QDateTimeEditPrivate *this,int sectionIndex,bool forward)

{
  bool bVar1;
  int *piVar2;
  byte in_DL;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  SectionNode SVar3;
  SectionNode SVar4;
  int size;
  SectionNode *node;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff80;
  QVariant *in_stack_ffffffffffffff88;
  QDateTimeEditPrivate *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QAbstractSpinBoxPrivate::specialValue(in_stack_ffffffffffffff80);
  if (bVar1) {
    QLineEdit::selectAll((QLineEdit *)in_stack_ffffffffffffff80);
  }
  else {
    piVar2 = (int *)QDateTimeParser::sectionNode((int)in_RDI + 0x3d8);
    if (((*piVar2 != 0) && (*piVar2 != 0x50000)) && (*piVar2 != 0x30000)) {
      this_00 = (QDateTimeEditPrivate *)&in_RDI[0x10].super_QWidget.data;
      (**(code **)(*(long *)&in_RDI->super_QWidget + 0x110))(local_20);
      updateCache(this_00,in_stack_ffffffffffffff88,(QString *)in_stack_ffffffffffffff80);
      QString::~QString((QString *)0x55a549);
      QDateTimeParser::sectionSize((int)in_RDI + 0x3d8);
      if ((in_DL & 1) == 0) {
        SVar4._0_8_ = &in_RDI[0x18].super_QWidget.field_0x18;
        SVar4.count = piVar2[0];
        SVar4.zeroesAdded = piVar2[1];
        QDateTimeParser::sectionPos(SVar4);
        QLineEdit::setSelection(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
      }
      else {
        SVar3._0_8_ = &in_RDI[0x18].super_QWidget.field_0x18;
        SVar3.count = piVar2[0];
        SVar3.zeroesAdded = piVar2[1];
        QDateTimeParser::sectionPos(SVar3);
        QLineEdit::setSelection(in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::setSelected(int sectionIndex, bool forward)
{
    if (specialValue()
#ifdef QT_KEYPAD_NAVIGATION
        || (QApplicationPrivate::keypadNavigationEnabled() && !edit->hasEditFocus())
#endif
        ) {
        edit->selectAll();
    } else {
        const SectionNode &node = sectionNode(sectionIndex);
        if (node.type == NoSection || node.type == LastSection || node.type == FirstSection)
            return;

        updateCache(value, displayText());
        const int size = sectionSize(sectionIndex);
        if (forward) {
            edit->setSelection(sectionPos(node), size);
        } else {
            edit->setSelection(sectionPos(node) + size, -size);
        }
    }
}